

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

size_t ma_dr_wav_write_raw(ma_dr_wav *pWav,size_t bytesToWrite,void *pData)

{
  long in_RDX;
  long in_RSI;
  long in_RDI;
  size_t bytesWritten;
  undefined8 local_8;
  
  if (((in_RDI == 0) || (in_RSI == 0)) || (in_RDX == 0)) {
    local_8 = 0;
  }
  else {
    local_8 = (**(code **)(in_RDI + 8))(*(undefined8 *)(in_RDI + 0x18),in_RDX,in_RSI);
    *(size_t *)(in_RDI + 0x80) = local_8 + *(long *)(in_RDI + 0x80);
  }
  return local_8;
}

Assistant:

MA_API size_t ma_dr_wav_write_raw(ma_dr_wav* pWav, size_t bytesToWrite, const void* pData)
{
    size_t bytesWritten;
    if (pWav == NULL || bytesToWrite == 0 || pData == NULL) {
        return 0;
    }
    bytesWritten = pWav->onWrite(pWav->pUserData, pData, bytesToWrite);
    pWav->dataChunkDataSize += bytesWritten;
    return bytesWritten;
}